

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O3

void __thiscall
TPZFrontSym<std::complex<double>_>::Reset
          (TPZFrontSym<std::complex<double>_> *this,int64_t GlobalSize)

{
  TPZVec<long> *this_00;
  complex<double> *pcVar1;
  long local_20;
  
  if ((this->super_TPZFront<std::complex<double>_>).fData.fNElements != 0) {
    (this->super_TPZFront<std::complex<double>_>).fData.fNElements = 0;
    (this->super_TPZFront<std::complex<double>_>).fData.fNAlloc = 0;
    pcVar1 = (this->super_TPZFront<std::complex<double>_>).fData.fStore;
    if (pcVar1 != (complex<double> *)0x0) {
      operator_delete__(pcVar1);
    }
    (this->super_TPZFront<std::complex<double>_>).fData.fStore = (complex<double> *)0x0;
  }
  TPZManVector<int,_10>::Resize
            (&(this->super_TPZFront<std::complex<double>_>).fFree.super_TPZManVector<int,_10>,0);
  (this->super_TPZFront<std::complex<double>_>).fFront = 0;
  TPZManVector<long,_10>::Resize(&(this->super_TPZFront<std::complex<double>_>).fGlobal,0);
  this_00 = &(this->super_TPZFront<std::complex<double>_>).fLocal;
  TPZVec<long>::Resize(this_00,GlobalSize);
  local_20 = -1;
  TPZVec<long>::Fill(this_00,&local_20,0,-1);
  (this->super_TPZFront<std::complex<double>_>).fMaxFront = 0;
  return;
}

Assistant:

void TPZFrontSym<TVar>::Reset(int64_t GlobalSize)
{
	this->fData.Resize(0);
	this->fFree.Resize(0);
	this->fFront=0;
	this->fGlobal.Resize(0);
	this->fLocal.Resize(GlobalSize);
	this->fLocal.Fill(-1);
	this->fMaxFront=0;
}